

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

char * stbi_zlib_decode_malloc_guesssize_headerflag
                 (char *buffer,int len,int initial_size,int *outlen,int parse_header)

{
  int iVar1;
  char *obuf;
  stbi__zbuf a;
  stbi__zbuf local_1028;
  
  obuf = (char *)malloc((long)initial_size);
  if (obuf != (char *)0x0) {
    local_1028.zbuffer_end = (stbi_uc *)(buffer + len);
    local_1028.zbuffer = (stbi_uc *)buffer;
    iVar1 = stbi__do_zlib(&local_1028,obuf,initial_size,1,parse_header);
    if (iVar1 != 0) {
      if (outlen != (int *)0x0) {
        *outlen = (int)local_1028.zout - (int)local_1028.zout_start;
      }
      return (char *)CONCAT44(local_1028.zout_start._4_4_,(int)local_1028.zout_start);
    }
    free((void *)CONCAT44(local_1028.zout_start._4_4_,(int)local_1028.zout_start));
  }
  return (char *)0x0;
}

Assistant:

STBIDEF char *stbi_zlib_decode_malloc_guesssize_headerflag(const char *buffer, int len, int initial_size, int *outlen, int parse_header)
{
   stbi__zbuf a;
   char *p = (char *) stbi__malloc(initial_size);
   if (p == NULL) return NULL;
   a.zbuffer = (stbi_uc *) buffer;
   a.zbuffer_end = (stbi_uc *) buffer + len;
   if (stbi__do_zlib(&a, p, initial_size, 1, parse_header)) {
      if (outlen) *outlen = (int) (a.zout - a.zout_start);
      return a.zout_start;
   } else {
      STBI_FREE(a.zout_start);
      return NULL;
   }
}